

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall JetHead::ServerSocket::listen(ServerSocket *this,int __fd,int __n)

{
  int iVar1;
  int res;
  int num_local;
  ServerSocket *this_local;
  
  iVar1 = Socket::getFd(&this->super_Socket);
  iVar1 = ::listen(iVar1,__fd);
  if (iVar1 == 0) {
    Socket::setConnected(&this->super_Socket,true,1);
  }
  else {
    jh_log_print(3,"int JetHead::ServerSocket::listen(int)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                 ,0x357,"Listen Failed");
  }
  return iVar1;
}

Assistant:

int ServerSocket::listen( int num )
{
	TRACE_BEGIN( LOG_LVL_INFO );

	int res = ::listen( getFd(), num );

	if ( res == 0 )
		setConnected( true );
	else
		LOG_WARN_PERROR( "Listen Failed" );
	
	return res;
}